

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O0

void duckdb::TemplatedFillLoop<unsigned_char>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  uchar uVar1;
  VectorType VVar2;
  bool bVar3;
  uchar *count_00;
  UnifiedVectorFormat *format;
  idx_t iVar4;
  uchar *puVar5;
  uint in_ECX;
  SelectionVector *in_RDX;
  Vector *in_RDI;
  idx_t res_idx;
  idx_t source_idx;
  idx_t i_2;
  uchar *data_1;
  UnifiedVectorFormat vdata;
  idx_t i_1;
  idx_t i;
  uchar *data;
  ValidityMask *result_mask;
  uchar *res;
  idx_t in_stack_ffffffffffffff08;
  UnifiedVectorFormat *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  UnifiedVectorFormat *this;
  undefined8 in_stack_ffffffffffffff38;
  Vector *in_stack_ffffffffffffff40;
  ulong uStack_b0;
  UnifiedVectorFormat UStack_90;
  ulong uStack_48;
  ulong uStack_40;
  uchar *puStack_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  Vector::SetVectorType
            (in_stack_ffffffffffffff40,(VectorType)((ulong)in_stack_ffffffffffffff38 >> 0x38));
  count_00 = FlatVector::GetData<unsigned_char>((Vector *)0x2e29112);
  format = (UnifiedVectorFormat *)FlatVector::Validity((Vector *)0x2e29127);
  VVar2 = Vector::GetVectorType(in_RDI);
  if (VVar2 == CONSTANT_VECTOR) {
    puStack_38 = ConstantVector::GetData<unsigned_char>((Vector *)0x2e29151);
    bVar3 = ConstantVector::IsNull((Vector *)0x2e29166);
    if (bVar3) {
      for (uStack_40 = 0; uStack_40 < in_ECX; uStack_40 = uStack_40 + 1) {
        SelectionVector::get_index(in_RDX,uStack_40);
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      }
    }
    else {
      for (uStack_48 = 0; uStack_48 < in_ECX; uStack_48 = uStack_48 + 1) {
        uVar1 = *puStack_38;
        puVar5 = count_00;
        iVar4 = SelectionVector::get_index(in_RDX,uStack_48);
        count_00[iVar4] = uVar1;
        count_00 = puVar5;
      }
    }
  }
  else {
    this = &UStack_90;
    UnifiedVectorFormat::UnifiedVectorFormat(this);
    Vector::ToUnifiedFormat
              ((Vector *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(idx_t)count_00,format);
    puVar5 = UnifiedVectorFormat::GetData<unsigned_char>(&UStack_90);
    for (uStack_b0 = 0; uStack_b0 < in_ECX; uStack_b0 = uStack_b0 + 1) {
      iVar4 = SelectionVector::get_index(UStack_90.sel,uStack_b0);
      in_stack_ffffffffffffff10 =
           (UnifiedVectorFormat *)SelectionVector::get_index(in_RDX,uStack_b0);
      count_00[(long)in_stack_ffffffffffffff10] = puVar5[iVar4];
      in_stack_ffffffffffffff1f =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                      (idx_t)in_stack_ffffffffffffff10);
      TemplatedValidityMask<unsigned_long>::Set
                ((TemplatedValidityMask<unsigned_long> *)this,
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                 SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0));
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}